

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse(parser *this,int fd)

{
  undefined1 local_2070 [8];
  parser p;
  fd_reader r;
  int fd_local;
  
  fd_reader::fd_reader((fd_reader *)&p.m_convert_numbers,fd,0xa00000,true);
  parser((parser *)local_2070,(reader *)&p.m_convert_numbers,true,0x19000,1000,true,true,true);
  parse(this);
  fd_reader::~fd_reader((fd_reader *)&p.m_convert_numbers);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse(int fd)
{
    fd_reader r(fd, max_message_length, true);
    parser p(r);
    return p.parse();
}